

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

bool QStyleSheetStyle::isNaturalChild(QObject *obj)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::objectName();
  uVar1 = QString::startsWith((QLatin1String *)&local_30,3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QStyleSheetStyle::isNaturalChild(const QObject *obj)
{
    if (obj->objectName().startsWith("qt_"_L1))
        return true;

    return false;
}